

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall
QAbstractEventDispatcher::filterNativeEvent
          (QAbstractEventDispatcher *this,QByteArray *eventType,void *message,qintptr *result)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  byte bVar4;
  ulong uVar5;
  
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x88) != 0) {
    lVar2 = *(long *)(lVar1 + 0x58);
    *(int *)(lVar2 + 0x88) = *(int *)(lVar2 + 0x88) + 1;
    if (*(long *)(lVar1 + 0x88) == 0) {
      *(int *)(lVar2 + 0x88) = *(int *)(lVar2 + 0x88) + -1;
    }
    else {
      uVar5 = 0;
      do {
        plVar3 = *(long **)(*(long *)(lVar1 + 0x80) + uVar5 * 8);
        if (plVar3 == (long *)0x0) {
          bVar4 = 4;
        }
        else {
          bVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,eventType,message,result);
        }
        if ((bVar4 & 3) != 0) goto LAB_0027166d;
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(ulong *)(lVar1 + 0x88));
      bVar4 = 0;
LAB_0027166d:
      *(int *)(lVar2 + 0x88) = *(int *)(lVar2 + 0x88) + -1;
      if ((bVar4 & 5) != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }